

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::VarPackedStruct::VarPackedStruct
          (VarPackedStruct *this,Generator *m,string *name,
          shared_ptr<kratos::PackedStruct> *packed_struct_)

{
  shared_ptr<kratos::PackedStruct> *packed_struct__local;
  string *name_local;
  Generator *m_local;
  VarPackedStruct *this_local;
  
  Var::Var(&this->super_Var,m,name,1,1,false);
  PackedInterface::PackedInterface(&this->super_PackedInterface);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0058c428;
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__0058c5a8;
  std::shared_ptr<kratos::PackedStruct>::shared_ptr(&this->struct_,packed_struct_);
  compute_width(this);
  return;
}

Assistant:

VarPackedStruct::VarPackedStruct(Generator *m, const std::string &name,
                                 std::shared_ptr<PackedStruct> packed_struct_)
    : Var(m, name, 1, 1, false), struct_(std::move(packed_struct_)) {
    compute_width();
}